

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20240722::debugging_internal::Demangle(char *mangled,char *out,size_t out_size)

{
  char *str;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  long lVar4;
  undefined1 uVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  State state;
  State local_30;
  
  if ((*mangled == '_') && (mangled[1] == 'R')) {
    uVar5 = absl::lts_20240722::debugging_internal::DemangleRustSymbolEncoding(mangled,out,out_size)
    ;
    return (bool)uVar5;
  }
  local_30.out_end_idx = (int)out_size;
  local_30.parse_state.mangled_idx = 0;
  local_30.parse_state.out_cur_idx = 0;
  local_30.parse_state.prev_name_idx = 0;
  local_30.parse_state._12_4_ = 0xffff0000;
  local_30.recursion_depth = 1;
  local_30.steps = 1;
  local_30.mangled_begin = mangled;
  local_30.out = out;
  bVar6 = ParseMangledName(&local_30);
  if (bVar6) {
    lVar7 = (long)local_30.parse_state.mangled_idx;
    if (local_30.mangled_begin[lVar7] != '\0') {
      str = local_30.mangled_begin + lVar7;
      lVar8 = 0;
      do {
        if (str[lVar8] != '.') {
          if (str[lVar8] == '\0') goto LAB_0010227b;
          break;
        }
        bVar1 = str[lVar8 + 1];
        bVar6 = (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a;
        if (bVar1 == 0x5f || bVar6) {
          lVar8 = lVar8 + 1;
          do {
            do {
              bVar2 = local_30.mangled_begin[lVar8 + lVar7 + 1];
              lVar8 = lVar8 + 1;
            } while (bVar2 == 0x5f);
          } while ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a);
          bVar3 = true;
          if (bVar2 == 0x2e) goto LAB_00102232;
        }
        else {
LAB_00102232:
          bVar3 = bVar1 == 0x5f || bVar6;
          if ((byte)(str[lVar8 + 1] - 0x30U) < 10) {
            lVar8 = lVar8 + 1;
            do {
              lVar4 = lVar8 + lVar7 + 1;
              lVar8 = lVar8 + 1;
            } while ((byte)(local_30.mangled_begin[lVar4] - 0x30U) < 10);
            bVar3 = true;
          }
        }
      } while (bVar3);
      if (local_30.mangled_begin[lVar7] != '@') goto LAB_0010228f;
      MaybeAppend(&local_30,str);
    }
LAB_0010227b:
    bVar6 = 0 < local_30.parse_state.out_cur_idx &&
            local_30.parse_state.out_cur_idx < local_30.out_end_idx;
  }
  else {
LAB_0010228f:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Demangle(const char* mangled, char* out, size_t out_size) {
  if (mangled[0] == '_' && mangled[1] == 'R') {
    return DemangleRustSymbolEncoding(mangled, out, out_size);
  }

  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !Overflowed(&state) &&
         state.parse_state.out_cur_idx > 0;
}